

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData(PerspectiveCameraData *this)

{
  PerspectiveCameraData *this_local;
  
  *(undefined8 *)&(this->from).field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->from).field_0 + 8) = 0;
  *(undefined8 *)&(this->to).field_0 = 0;
  *(undefined8 *)((long)&(this->to).field_0 + 8) = 0;
  *(undefined8 *)&(this->up).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->up).field_0 + 8) = 0;
  this->fov = 30.0;
  return;
}

Assistant:

PerspectiveCameraData()
        : from(1,0,0), to(0,0,0), up(0,1,0), fov(30) {}